

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O3

CURLcode Curl_dynhds_add(dynhds *dynhds,char *name,size_t namelen,char *value,size_t valuelen)

{
  long lVar1;
  uint uVar2;
  dynhds_entry *pdVar3;
  ulong uVar4;
  dynhds_entry **__dest;
  size_t sVar5;
  ulong uVar6;
  CURLcode CVar7;
  char *__dest_00;
  ulong uVar8;
  
  if ((dynhds->max_entries == 0) ||
     (CVar7 = CURLE_OUT_OF_MEMORY, dynhds->hds_len < dynhds->max_entries)) {
    lVar1 = valuelen + namelen;
    CVar7 = CURLE_OUT_OF_MEMORY;
    if (dynhds->strs_len + lVar1 <= dynhds->max_strs_size) {
      uVar2 = dynhds->opts;
      pdVar3 = (dynhds_entry *)(*Curl_ccalloc)(1,lVar1 + 0x22);
      if (pdVar3 != (dynhds_entry *)0x0) {
        pdVar3->name = (char *)(pdVar3 + 1);
        memcpy(pdVar3 + 1,name,namelen);
        pdVar3->namelen = namelen;
        __dest_00 = (char *)((long)&pdVar3[1].name + namelen + 1);
        pdVar3->value = __dest_00;
        memcpy(__dest_00,value,valuelen);
        pdVar3->valuelen = valuelen;
        if ((uVar2 & 1) != 0) {
          Curl_strntolower(pdVar3->name,pdVar3->name,pdVar3->namelen);
        }
        sVar5 = dynhds->hds_len;
        uVar6 = sVar5 + 1;
        if (uVar6 < dynhds->hds_allc) {
          __dest = dynhds->hds;
        }
        else {
          uVar4 = sVar5 + 0x10;
          uVar6 = dynhds->max_entries;
          uVar8 = uVar6;
          if (uVar4 < uVar6) {
            uVar8 = uVar4;
          }
          if (uVar6 == 0) {
            uVar8 = uVar4;
          }
          __dest = (dynhds_entry **)(*Curl_ccalloc)(uVar8,8);
          if (__dest == (dynhds_entry **)0x0) {
            (*Curl_cfree)(pdVar3);
            return CURLE_OUT_OF_MEMORY;
          }
          if (dynhds->hds != (dynhds_entry **)0x0) {
            memcpy(__dest,dynhds->hds,dynhds->hds_len << 3);
            (*Curl_cfree)(dynhds->hds);
          }
          dynhds->hds = __dest;
          dynhds->hds_allc = uVar8;
          sVar5 = dynhds->hds_len;
          uVar6 = sVar5 + 1;
        }
        dynhds->hds_len = uVar6;
        __dest[sVar5] = pdVar3;
        dynhds->strs_len = dynhds->strs_len + lVar1;
        CVar7 = CURLE_OK;
      }
    }
  }
  return CVar7;
}

Assistant:

CURLcode Curl_dynhds_add(struct dynhds *dynhds,
                         const char *name, size_t namelen,
                         const char *value, size_t valuelen)
{
  struct dynhds_entry *entry = NULL;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  DEBUGASSERT(dynhds);
  if(dynhds->max_entries && dynhds->hds_len >= dynhds->max_entries)
    return CURLE_OUT_OF_MEMORY;
  if(dynhds->strs_len + namelen + valuelen > dynhds->max_strs_size)
    return CURLE_OUT_OF_MEMORY;

entry = entry_new(name, namelen, value, valuelen, dynhds->opts);
  if(!entry)
    goto out;

  if(dynhds->hds_len + 1 >= dynhds->hds_allc) {
    size_t nallc = dynhds->hds_len + 16;
    struct dynhds_entry **nhds;

    if(dynhds->max_entries && nallc > dynhds->max_entries)
      nallc = dynhds->max_entries;

    nhds = calloc(nallc, sizeof(struct dynhds_entry *));
    if(!nhds)
      goto out;
    if(dynhds->hds) {
      memcpy(nhds, dynhds->hds,
             dynhds->hds_len * sizeof(struct dynhds_entry *));
      Curl_safefree(dynhds->hds);
    }
    dynhds->hds = nhds;
    dynhds->hds_allc = nallc;
  }
  dynhds->hds[dynhds->hds_len++] = entry;
  entry = NULL;
  dynhds->strs_len += namelen + valuelen;
  result = CURLE_OK;

out:
  if(entry)
    entry_free(entry);
  return result;
}